

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

void __thiscall deqp::egl::MultiThreadedObjectTest::deinit(MultiThreadedObjectTest *this)

{
  long *plVar1;
  deUint32 dVar2;
  Library *pLVar3;
  pointer ppvVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppvVar7;
  pointer ppVar8;
  pointer ppVar9;
  long lVar10;
  long lVar11;
  
  pLVar3 = EglTestContext::getLibrary((this->super_MultiThreadedTest).super_TestCase.m_eglTestCtx);
  ppvVar4 = (this->m_pbuffers0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar7 = (this->m_pbuffers0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3)) {
    lVar10 = 0;
    do {
      if (ppvVar4[lVar10] != (void *)0x0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"eglDestroySurface()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x30e);
        (this->m_pbuffers0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar10] = (void *)0x0;
        ppvVar4 = (this->m_pbuffers0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppvVar7 = (this->m_pbuffers0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3));
  }
  if (ppvVar7 != ppvVar4) {
    (this->m_pbuffers0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar4;
  }
  ppvVar4 = (this->m_pbuffers1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar7 = (this->m_pbuffers1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3)) {
    lVar10 = 0;
    do {
      if (ppvVar4[lVar10] != (void *)0x0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"eglDestroySurface()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x319);
        (this->m_pbuffers1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar10] = (void *)0x0;
        ppvVar4 = (this->m_pbuffers1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppvVar7 = (this->m_pbuffers1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3));
  }
  if (ppvVar7 != ppvVar4) {
    (this->m_pbuffers1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar4;
  }
  ppvVar4 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar7 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3)) {
    lVar10 = 0;
    do {
      if (ppvVar4[lVar10] != (void *)0x0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"eglDestroySurface()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x324);
        (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar10] = (void *)0x0;
        ppvVar4 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppvVar7 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3));
  }
  if (ppvVar7 != ppvVar4) {
    (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar4;
  }
  ppvVar4 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar7 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3)) {
    lVar10 = 0;
    do {
      if (ppvVar4[lVar10] != (void *)0x0) {
        (*pLVar3->_vptr_Library[0x13])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"eglDestroyContext()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x32f);
        (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar10] = (void *)0x0;
        ppvVar4 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppvVar7 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3));
  }
  if (ppvVar7 != ppvVar4) {
    (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar4;
  }
  ppvVar4 = (this->m_contexts0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar7 = (this->m_contexts0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3)) {
    lVar10 = 0;
    do {
      if (ppvVar4[lVar10] != (void *)0x0) {
        (*pLVar3->_vptr_Library[0x13])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"eglDestroyContext()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x33a);
        (this->m_contexts0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar10] = (void *)0x0;
        ppvVar4 = (this->m_contexts0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppvVar7 = (this->m_contexts0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3));
  }
  if (ppvVar7 != ppvVar4) {
    (this->m_contexts0).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar4;
  }
  ppvVar4 = (this->m_contexts1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar7 = (this->m_contexts1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3)) {
    lVar10 = 0;
    do {
      if (ppvVar4[lVar10] != (void *)0x0) {
        (*pLVar3->_vptr_Library[0x13])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"eglDestroyContext()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x345);
        (this->m_contexts1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar10] = (void *)0x0;
        ppvVar4 = (this->m_contexts1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppvVar7 = (this->m_contexts1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)ppvVar7 - (long)ppvVar4) >> 3));
  }
  if (ppvVar7 != ppvVar4) {
    (this->m_contexts1).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar4;
  }
  ppVar5 = (this->m_nativePixmaps0).
           super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (this->m_nativePixmaps0).
           super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppVar8 - (long)ppVar5) >> 4)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      if (*(long *)((long)&ppVar5->second + lVar11) != 0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"destroySurface(m_display, m_nativePixmaps0[pixmapNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x34f);
        ppVar5 = (this->m_nativePixmaps0).
                 super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar5->second + lVar11) = 0;
      plVar1 = *(long **)((long)&ppVar5->first + lVar11);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        ppVar5 = (this->m_nativePixmaps0).
                 super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar5->first + lVar11) = 0;
      lVar10 = lVar10 + 1;
      ppVar8 = (this->m_nativePixmaps0).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 < (int)((ulong)((long)ppVar8 - (long)ppVar5) >> 4));
  }
  if (ppVar8 != ppVar5) {
    (this->m_nativePixmaps0).
    super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  }
  ppVar5 = (this->m_nativePixmaps1).
           super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (this->m_nativePixmaps1).
           super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppVar8 - (long)ppVar5) >> 4)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      if (*(long *)((long)&ppVar5->second + lVar11) != 0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"destroySurface(m_display, m_nativePixmaps1[pixmapNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x35a);
        ppVar5 = (this->m_nativePixmaps1).
                 super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar5->second + lVar11) = 0;
      plVar1 = *(long **)((long)&ppVar5->first + lVar11);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        ppVar5 = (this->m_nativePixmaps1).
                 super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar5->first + lVar11) = 0;
      lVar10 = lVar10 + 1;
      ppVar8 = (this->m_nativePixmaps1).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 < (int)((ulong)((long)ppVar8 - (long)ppVar5) >> 4));
  }
  if (ppVar8 != ppVar5) {
    (this->m_nativePixmaps1).
    super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  }
  ppVar5 = (this->m_sharedNativePixmaps).
           super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (this->m_sharedNativePixmaps).
           super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppVar8 - (long)ppVar5) >> 4)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      if (*(long *)((long)&ppVar5->second + lVar11) != 0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"destroySurface(m_display, m_sharedNativePixmaps[pixmapNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x365);
        ppVar5 = (this->m_sharedNativePixmaps).
                 super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar5->second + lVar11) = 0;
      plVar1 = *(long **)((long)&ppVar5->first + lVar11);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        ppVar5 = (this->m_sharedNativePixmaps).
                 super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar5->first + lVar11) = 0;
      lVar10 = lVar10 + 1;
      ppVar8 = (this->m_sharedNativePixmaps).
               super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 < (int)((ulong)((long)ppVar8 - (long)ppVar5) >> 4));
  }
  if (ppVar8 != ppVar5) {
    (this->m_sharedNativePixmaps).
    super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  }
  ppVar6 = (this->m_nativeWindows1).
           super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = (this->m_nativeWindows1).
           super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppVar9 - (long)ppVar6) >> 4)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      if (*(long *)((long)&ppVar6->second + lVar11) != 0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"destroySurface(m_display, m_nativeWindows1[windowNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x371);
        ppVar6 = (this->m_nativeWindows1).
                 super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar6->second + lVar11) = 0;
      plVar1 = *(long **)((long)&ppVar6->first + lVar11);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        ppVar6 = (this->m_nativeWindows1).
                 super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar6->first + lVar11) = 0;
      lVar10 = lVar10 + 1;
      ppVar9 = (this->m_nativeWindows1).
               super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 < (int)((ulong)((long)ppVar9 - (long)ppVar6) >> 4));
  }
  if (ppVar9 != ppVar6) {
    (this->m_nativeWindows1).
    super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
  }
  ppVar6 = (this->m_nativeWindows0).
           super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = (this->m_nativeWindows0).
           super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppVar9 - (long)ppVar6) >> 4)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      if (*(long *)((long)&ppVar6->second + lVar11) != 0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"destroySurface(m_display, m_nativeWindows0[windowNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x37c);
        ppVar6 = (this->m_nativeWindows0).
                 super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar6->second + lVar11) = 0;
      plVar1 = *(long **)((long)&ppVar6->first + lVar11);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        ppVar6 = (this->m_nativeWindows0).
                 super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar6->first + lVar11) = 0;
      lVar10 = lVar10 + 1;
      ppVar9 = (this->m_nativeWindows0).
               super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 < (int)((ulong)((long)ppVar9 - (long)ppVar6) >> 4));
  }
  if (ppVar9 != ppVar6) {
    (this->m_nativeWindows0).
    super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
  }
  ppVar6 = (this->m_sharedNativeWindows).
           super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = (this->m_sharedNativeWindows).
           super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppVar9 - (long)ppVar6) >> 4)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      if (*(long *)((long)&ppVar6->second + lVar11) != 0) {
        (*pLVar3->_vptr_Library[0x16])(pLVar3,(this->super_MultiThreadedTest).m_display);
        dVar2 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
        eglu::checkError(dVar2,"destroySurface(m_display, m_sharedNativeWindows[windowNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x387);
        ppVar6 = (this->m_sharedNativeWindows).
                 super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar6->second + lVar11) = 0;
      plVar1 = *(long **)((long)&ppVar6->first + lVar11);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        ppVar6 = (this->m_sharedNativeWindows).
                 super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(undefined8 *)((long)&ppVar6->first + lVar11) = 0;
      lVar10 = lVar10 + 1;
      ppVar9 = (this->m_sharedNativeWindows).
               super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 < (int)((ulong)((long)ppVar9 - (long)ppVar6) >> 4));
  }
  if (ppVar9 != ppVar6) {
    (this->m_sharedNativeWindows).
    super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
  }
  MultiThreadedTest::deinit(&this->super_MultiThreadedTest);
  return;
}

Assistant:

void MultiThreadedObjectTest::deinit (void)
{
	const Library&		egl		= getLibrary();

	// Clear pbuffers
	for (int pbufferNdx = 0; pbufferNdx < (int)m_pbuffers0.size(); pbufferNdx++)
	{
		if (m_pbuffers0[pbufferNdx] != EGL_NO_SURFACE)
		{
			egl.destroySurface(m_display, m_pbuffers0[pbufferNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			m_pbuffers0[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	m_pbuffers0.clear();

	for (int pbufferNdx = 0; pbufferNdx < (int)m_pbuffers1.size(); pbufferNdx++)
	{
		if (m_pbuffers1[pbufferNdx] != EGL_NO_SURFACE)
		{
			egl.destroySurface(m_display, m_pbuffers1[pbufferNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			m_pbuffers1[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	m_pbuffers1.clear();

	for (int pbufferNdx = 0; pbufferNdx < (int)m_sharedPbuffers.size(); pbufferNdx++)
	{
		if (m_sharedPbuffers[pbufferNdx] != EGL_NO_SURFACE)
		{
			egl.destroySurface(m_display, m_sharedPbuffers[pbufferNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			m_sharedPbuffers[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	m_sharedPbuffers.clear();

	for (int contextNdx = 0; contextNdx < (int)m_sharedContexts.size(); contextNdx++)
	{
		if (m_sharedContexts[contextNdx] != EGL_NO_CONTEXT)
		{
			egl.destroyContext(m_display, m_sharedContexts[contextNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroyContext()");
			m_sharedContexts[contextNdx] =  EGL_NO_CONTEXT;
		}
	}
	m_sharedContexts.clear();

	for (int contextNdx = 0; contextNdx < (int)m_contexts0.size(); contextNdx++)
	{
		if (m_contexts0[contextNdx] != EGL_NO_CONTEXT)
		{
			egl.destroyContext(m_display, m_contexts0[contextNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroyContext()");
			m_contexts0[contextNdx] =  EGL_NO_CONTEXT;
		}
	}
	m_contexts0.clear();

	for (int contextNdx = 0; contextNdx < (int)m_contexts1.size(); contextNdx++)
	{
		if (m_contexts1[contextNdx] != EGL_NO_CONTEXT)
		{
			egl.destroyContext(m_display, m_contexts1[contextNdx]);
			EGLU_CHECK_MSG(egl, "eglDestroyContext()");
			m_contexts1[contextNdx] =  EGL_NO_CONTEXT;
		}
	}
	m_contexts1.clear();

	// Clear pixmaps
	for (int pixmapNdx = 0; pixmapNdx < (int)m_nativePixmaps0.size(); pixmapNdx++)
	{
		if (m_nativePixmaps0[pixmapNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_nativePixmaps0[pixmapNdx].second));

		m_nativePixmaps0[pixmapNdx].second = EGL_NO_SURFACE;
		delete m_nativePixmaps0[pixmapNdx].first;
		m_nativePixmaps0[pixmapNdx].first = NULL;
	}
	m_nativePixmaps0.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)m_nativePixmaps1.size(); pixmapNdx++)
	{
		if (m_nativePixmaps1[pixmapNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_nativePixmaps1[pixmapNdx].second));

		m_nativePixmaps1[pixmapNdx].second = EGL_NO_SURFACE;
		delete m_nativePixmaps1[pixmapNdx].first;
		m_nativePixmaps1[pixmapNdx].first = NULL;
	}
	m_nativePixmaps1.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)m_sharedNativePixmaps.size(); pixmapNdx++)
	{
		if (m_sharedNativePixmaps[pixmapNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_sharedNativePixmaps[pixmapNdx].second));

		m_sharedNativePixmaps[pixmapNdx].second = EGL_NO_SURFACE;
		delete m_sharedNativePixmaps[pixmapNdx].first;
		m_sharedNativePixmaps[pixmapNdx].first = NULL;
	}
	m_sharedNativePixmaps.clear();

	// Clear windows
	for (int windowNdx = 0; windowNdx < (int)m_nativeWindows1.size(); windowNdx++)
	{
		if (m_nativeWindows1[windowNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_nativeWindows1[windowNdx].second));

		m_nativeWindows1[windowNdx].second = EGL_NO_SURFACE;
		delete m_nativeWindows1[windowNdx].first;
		m_nativeWindows1[windowNdx].first = NULL;
	}
	m_nativeWindows1.clear();

	for (int windowNdx = 0; windowNdx < (int)m_nativeWindows0.size(); windowNdx++)
	{
		if (m_nativeWindows0[windowNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_nativeWindows0[windowNdx].second));

		m_nativeWindows0[windowNdx].second = EGL_NO_SURFACE;
		delete m_nativeWindows0[windowNdx].first;
		m_nativeWindows0[windowNdx].first = NULL;
	}
	m_nativeWindows0.clear();

	for (int windowNdx = 0; windowNdx < (int)m_sharedNativeWindows.size(); windowNdx++)
	{
		if (m_sharedNativeWindows[windowNdx].second != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_display, m_sharedNativeWindows[windowNdx].second));

		m_sharedNativeWindows[windowNdx].second = EGL_NO_SURFACE;
		delete m_sharedNativeWindows[windowNdx].first;
		m_sharedNativeWindows[windowNdx].first = NULL;
	}
	m_sharedNativeWindows.clear();

	MultiThreadedTest::deinit();
}